

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  ulong uVar59;
  long lVar60;
  long lVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong *puVar65;
  ulong uVar66;
  ulong uVar67;
  uint uVar68;
  undefined4 uVar69;
  ulong unaff_R14;
  size_t mask;
  bool bVar70;
  bool bVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar115;
  float fVar119;
  float fVar120;
  undefined1 auVar116 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar117 [32];
  float fVar121;
  undefined1 auVar118 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 *local_d00;
  ulong local_cf8;
  ulong *local_cf0;
  ulong local_ce8;
  undefined1 local_ce0 [32];
  Scene *local_cc0;
  undefined1 auStack_cb8 [24];
  RTCFilterFunctionNArguments local_c90;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined4 local_c10;
  undefined4 uStack_c0c;
  undefined4 uStack_c08;
  undefined4 uStack_c04;
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined4 local_bc0;
  undefined4 uStack_bbc;
  undefined4 uStack_bb8;
  undefined4 uStack_bb4;
  undefined1 local_bb0 [16];
  uint local_ba0;
  uint uStack_b9c;
  uint uStack_b98;
  uint uStack_b94;
  uint uStack_b90;
  uint uStack_b8c;
  uint uStack_b88;
  uint uStack_b84;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  undefined4 uStack_b64;
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880 [4];
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar112._4_4_ = uVar69;
  auVar112._0_4_ = uVar69;
  auVar112._8_4_ = uVar69;
  auVar112._12_4_ = uVar69;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar116._4_4_ = uVar69;
  auVar116._0_4_ = uVar69;
  auVar116._8_4_ = uVar69;
  auVar116._12_4_ = uVar69;
  uVar69 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar125._4_4_ = uVar69;
  auVar125._0_4_ = uVar69;
  auVar125._8_4_ = uVar69;
  auVar125._12_4_ = uVar69;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar29 = fVar1 * 0.99999964;
  fVar30 = fVar2 * 0.99999964;
  fVar31 = fVar3 * 0.99999964;
  fVar1 = fVar1 * 1.0000004;
  fVar2 = fVar2 * 1.0000004;
  fVar3 = fVar3 * 1.0000004;
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar67 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_ce8 = uVar62 ^ 0x10;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar93._4_4_ = iVar4;
  auVar93._0_4_ = iVar4;
  auVar93._8_4_ = iVar4;
  auVar93._12_4_ = iVar4;
  local_b60._16_16_ = mm_lookupmask_ps._240_16_;
  local_b60._0_16_ = mm_lookupmask_ps._0_16_;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar96._4_4_ = iVar4;
  auVar96._0_4_ = iVar4;
  auVar96._8_4_ = iVar4;
  auVar96._12_4_ = iVar4;
  local_d00 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar88._8_4_ = 0x3f800000;
  auVar88._0_8_ = &DAT_3f8000003f800000;
  auVar88._12_4_ = 0x3f800000;
  auVar88._16_4_ = 0x3f800000;
  auVar88._20_4_ = 0x3f800000;
  auVar88._24_4_ = 0x3f800000;
  auVar88._28_4_ = 0x3f800000;
  auVar74._8_4_ = 0xbf800000;
  auVar74._0_8_ = 0xbf800000bf800000;
  auVar74._12_4_ = 0xbf800000;
  auVar74._16_4_ = 0xbf800000;
  auVar74._20_4_ = 0xbf800000;
  auVar74._24_4_ = 0xbf800000;
  auVar74._28_4_ = 0xbf800000;
  _local_b80 = vblendvps_avx(auVar88,auVar74,local_b60);
  puVar65 = local_7f8;
  do {
    local_cf0 = puVar65;
    if (local_cf0 == &local_800) break;
    puVar65 = local_cf0 + -1;
    uVar64 = local_cf0[-1];
    do {
      if ((uVar64 & 8) == 0) {
        auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar66),auVar112);
        auVar72._0_4_ = fVar29 * auVar73._0_4_;
        auVar72._4_4_ = fVar29 * auVar73._4_4_;
        auVar72._8_4_ = fVar29 * auVar73._8_4_;
        auVar72._12_4_ = fVar29 * auVar73._12_4_;
        auVar73 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar67),auVar116);
        auVar77._0_4_ = fVar30 * auVar73._0_4_;
        auVar77._4_4_ = fVar30 * auVar73._4_4_;
        auVar77._8_4_ = fVar30 * auVar73._8_4_;
        auVar77._12_4_ = fVar30 * auVar73._12_4_;
        auVar73 = vmaxps_avx(auVar72,auVar77);
        auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + uVar62),auVar125);
        auVar78._0_4_ = fVar31 * auVar72._0_4_;
        auVar78._4_4_ = fVar31 * auVar72._4_4_;
        auVar78._8_4_ = fVar31 * auVar72._8_4_;
        auVar78._12_4_ = fVar31 * auVar72._12_4_;
        auVar72 = vmaxps_avx(auVar78,auVar93);
        auVar73 = vmaxps_avx(auVar73,auVar72);
        auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + (uVar66 ^ 0x10)),auVar112);
        auVar79._0_4_ = fVar1 * auVar72._0_4_;
        auVar79._4_4_ = fVar1 * auVar72._4_4_;
        auVar79._8_4_ = fVar1 * auVar72._8_4_;
        auVar79._12_4_ = fVar1 * auVar72._12_4_;
        auVar72 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + (uVar67 ^ 0x10)),auVar116);
        auVar85._0_4_ = fVar2 * auVar72._0_4_;
        auVar85._4_4_ = fVar2 * auVar72._4_4_;
        auVar85._8_4_ = fVar2 * auVar72._8_4_;
        auVar85._12_4_ = fVar2 * auVar72._12_4_;
        auVar72 = vminps_avx(auVar79,auVar85);
        auVar77 = vsubps_avx(*(undefined1 (*) [16])(uVar64 + 0x20 + local_ce8),auVar125);
        auVar86._0_4_ = fVar3 * auVar77._0_4_;
        auVar86._4_4_ = fVar3 * auVar77._4_4_;
        auVar86._8_4_ = fVar3 * auVar77._8_4_;
        auVar86._12_4_ = fVar3 * auVar77._12_4_;
        auVar77 = vminps_avx(auVar86,auVar96);
        auVar72 = vminps_avx(auVar72,auVar77);
        auVar73 = vcmpps_avx(auVar73,auVar72,2);
        uVar69 = vmovmskps_avx(auVar73);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),uVar69);
      }
      if ((uVar64 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar68 = 4;
        }
        else {
          uVar63 = uVar64 & 0xfffffffffffffff0;
          lVar61 = 0;
          for (uVar64 = unaff_R14; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
            lVar61 = lVar61 + 1;
          }
          uVar68 = 0;
          for (uVar59 = unaff_R14 - 1 & unaff_R14; uVar64 = *(ulong *)(uVar63 + lVar61 * 8),
              uVar59 != 0; uVar59 = uVar59 - 1 & uVar59) {
            *puVar65 = uVar64;
            puVar65 = puVar65 + 1;
            lVar61 = 0;
            for (uVar64 = uVar59; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
              lVar61 = lVar61 + 1;
            }
          }
        }
      }
      else {
        uVar68 = 6;
      }
    } while (uVar68 == 0);
    if (uVar68 == 6) {
      uVar68 = 0;
      local_cf8 = (ulong)((uint)uVar64 & 0xf) - 8;
      bVar70 = local_cf8 != 0;
      if (bVar70) {
        uVar64 = uVar64 & 0xfffffffffffffff0;
        uVar63 = 0;
        do {
          lVar60 = uVar63 * 0xe0;
          lVar61 = uVar64 + 0xd0 + lVar60;
          local_a00 = *(undefined8 *)(lVar61 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar61 + 0x18);
          lVar61 = uVar64 + 0xc0 + lVar60;
          local_9e0 = *(undefined8 *)(lVar61 + 0x10);
          uStack_9d8 = *(undefined8 *)(lVar61 + 0x18);
          uStack_9d0 = local_9e0;
          uStack_9c8 = uStack_9d8;
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          auVar75._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x60 + lVar60);
          auVar75._0_16_ = *(undefined1 (*) [16])(uVar64 + lVar60);
          auVar80._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x70 + lVar60);
          auVar80._0_16_ = *(undefined1 (*) [16])(uVar64 + 0x10 + lVar60);
          auVar89._16_16_ = *(undefined1 (*) [16])(uVar64 + 0x80 + lVar60);
          auVar89._0_16_ = *(undefined1 (*) [16])(uVar64 + 0x20 + lVar60);
          auVar73 = *(undefined1 (*) [16])(uVar64 + 0x30 + lVar60);
          auVar94._16_16_ = auVar73;
          auVar94._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar64 + 0x40 + lVar60);
          auVar97._16_16_ = auVar73;
          auVar97._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar64 + 0x50 + lVar60);
          auVar102._16_16_ = auVar73;
          auVar102._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar64 + 0x90 + lVar60);
          auVar110._16_16_ = auVar73;
          auVar110._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar64 + 0xa0 + lVar60);
          auVar131._16_16_ = auVar73;
          auVar131._0_16_ = auVar73;
          auVar73 = *(undefined1 (*) [16])(uVar64 + 0xb0 + lVar60);
          auVar113._16_16_ = auVar73;
          auVar113._0_16_ = auVar73;
          uVar69 = *(undefined4 *)(ray + k * 4);
          auVar128._4_4_ = uVar69;
          auVar128._0_4_ = uVar69;
          auVar128._8_4_ = uVar69;
          auVar128._12_4_ = uVar69;
          auVar128._16_4_ = uVar69;
          auVar128._20_4_ = uVar69;
          auVar128._24_4_ = uVar69;
          auVar128._28_4_ = uVar69;
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar129._4_4_ = uVar69;
          auVar129._0_4_ = uVar69;
          auVar129._8_4_ = uVar69;
          auVar129._12_4_ = uVar69;
          auVar129._16_4_ = uVar69;
          auVar129._20_4_ = uVar69;
          auVar129._24_4_ = uVar69;
          auVar129._28_4_ = uVar69;
          uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar130._4_4_ = uVar5;
          auVar130._0_4_ = uVar5;
          auVar130._8_4_ = uVar5;
          auVar130._12_4_ = uVar5;
          auVar130._16_4_ = uVar5;
          auVar130._20_4_ = uVar5;
          auVar130._24_4_ = uVar5;
          auVar130._28_4_ = uVar5;
          local_c40 = vsubps_avx(auVar75,auVar128);
          local_c60 = vsubps_avx(auVar80,auVar129);
          local_a20 = vsubps_avx(auVar89,auVar130);
          auVar74 = vsubps_avx(auVar94,auVar128);
          auVar88 = vsubps_avx(auVar97,auVar129);
          auVar84 = vsubps_avx(auVar102,auVar130);
          auVar75 = vsubps_avx(auVar110,auVar128);
          auVar80 = vsubps_avx(auVar131,auVar129);
          auVar32 = vsubps_avx(auVar113,auVar130);
          local_a40 = vsubps_avx(auVar75,local_c40);
          local_a80 = vsubps_avx(auVar80,local_c60);
          local_a60 = vsubps_avx(auVar32,local_a20);
          auVar76._0_4_ = auVar75._0_4_ + local_c40._0_4_;
          auVar76._4_4_ = auVar75._4_4_ + local_c40._4_4_;
          auVar76._8_4_ = auVar75._8_4_ + local_c40._8_4_;
          auVar76._12_4_ = auVar75._12_4_ + local_c40._12_4_;
          auVar76._16_4_ = auVar75._16_4_ + local_c40._16_4_;
          auVar76._20_4_ = auVar75._20_4_ + local_c40._20_4_;
          auVar76._24_4_ = auVar75._24_4_ + local_c40._24_4_;
          auVar76._28_4_ = auVar75._28_4_ + local_c40._28_4_;
          auVar95._0_4_ = auVar80._0_4_ + local_c60._0_4_;
          auVar95._4_4_ = auVar80._4_4_ + local_c60._4_4_;
          auVar95._8_4_ = auVar80._8_4_ + local_c60._8_4_;
          auVar95._12_4_ = auVar80._12_4_ + local_c60._12_4_;
          auVar95._16_4_ = auVar80._16_4_ + local_c60._16_4_;
          auVar95._20_4_ = auVar80._20_4_ + local_c60._20_4_;
          auVar95._24_4_ = auVar80._24_4_ + local_c60._24_4_;
          auVar95._28_4_ = auVar80._28_4_ + local_c60._28_4_;
          fVar7 = local_a20._0_4_;
          auVar98._0_4_ = auVar32._0_4_ + fVar7;
          fVar8 = local_a20._4_4_;
          auVar98._4_4_ = auVar32._4_4_ + fVar8;
          fVar9 = local_a20._8_4_;
          auVar98._8_4_ = auVar32._8_4_ + fVar9;
          fVar10 = local_a20._12_4_;
          auVar98._12_4_ = auVar32._12_4_ + fVar10;
          fVar11 = local_a20._16_4_;
          auVar98._16_4_ = auVar32._16_4_ + fVar11;
          fVar12 = local_a20._20_4_;
          auVar98._20_4_ = auVar32._20_4_ + fVar12;
          fVar13 = local_a20._24_4_;
          fVar119 = auVar32._28_4_;
          auVar98._24_4_ = auVar32._24_4_ + fVar13;
          fVar101 = local_a20._28_4_;
          auVar98._28_4_ = fVar119 + fVar101;
          auVar33._4_4_ = local_a60._4_4_ * auVar95._4_4_;
          auVar33._0_4_ = local_a60._0_4_ * auVar95._0_4_;
          auVar33._8_4_ = local_a60._8_4_ * auVar95._8_4_;
          auVar33._12_4_ = local_a60._12_4_ * auVar95._12_4_;
          auVar33._16_4_ = local_a60._16_4_ * auVar95._16_4_;
          auVar33._20_4_ = local_a60._20_4_ * auVar95._20_4_;
          auVar33._24_4_ = local_a60._24_4_ * auVar95._24_4_;
          auVar33._28_4_ = uVar69;
          auVar72 = vfmsub231ps_fma(auVar33,local_a80,auVar98);
          auVar36._4_4_ = auVar98._4_4_ * local_a40._4_4_;
          auVar36._0_4_ = auVar98._0_4_ * local_a40._0_4_;
          auVar36._8_4_ = auVar98._8_4_ * local_a40._8_4_;
          auVar36._12_4_ = auVar98._12_4_ * local_a40._12_4_;
          auVar36._16_4_ = auVar98._16_4_ * local_a40._16_4_;
          auVar36._20_4_ = auVar98._20_4_ * local_a40._20_4_;
          auVar36._24_4_ = auVar98._24_4_ * local_a40._24_4_;
          auVar36._28_4_ = auVar98._28_4_;
          auVar73 = vfmsub231ps_fma(auVar36,local_a60,auVar76);
          auVar37._4_4_ = auVar76._4_4_ * local_a80._4_4_;
          auVar37._0_4_ = auVar76._0_4_ * local_a80._0_4_;
          auVar37._8_4_ = auVar76._8_4_ * local_a80._8_4_;
          auVar37._12_4_ = auVar76._12_4_ * local_a80._12_4_;
          auVar37._16_4_ = auVar76._16_4_ * local_a80._16_4_;
          auVar37._20_4_ = auVar76._20_4_ * local_a80._20_4_;
          auVar37._24_4_ = auVar76._24_4_ * local_a80._24_4_;
          auVar37._28_4_ = auVar76._28_4_;
          auVar77 = vfmsub231ps_fma(auVar37,local_a40,auVar95);
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar114._4_4_ = uVar69;
          auVar114._0_4_ = uVar69;
          auVar114._8_4_ = uVar69;
          auVar114._12_4_ = uVar69;
          auVar114._16_4_ = uVar69;
          auVar114._20_4_ = uVar69;
          auVar114._24_4_ = uVar69;
          auVar114._28_4_ = uVar69;
          local_aa0 = *(float *)(ray + k * 4 + 0x60);
          auVar38._4_4_ = local_aa0 * auVar77._4_4_;
          auVar38._0_4_ = local_aa0 * auVar77._0_4_;
          auVar38._8_4_ = local_aa0 * auVar77._8_4_;
          auVar38._12_4_ = local_aa0 * auVar77._12_4_;
          auVar38._16_4_ = local_aa0 * 0.0;
          auVar38._20_4_ = local_aa0 * 0.0;
          auVar38._24_4_ = local_aa0 * 0.0;
          auVar38._28_4_ = auVar95._28_4_;
          auVar73 = vfmadd231ps_fma(auVar38,auVar114,ZEXT1632(auVar73));
          uVar69 = *(undefined4 *)(ray + k * 4 + 0x40);
          local_ce0._4_4_ = uVar69;
          local_ce0._0_4_ = uVar69;
          local_ce0._8_4_ = uVar69;
          local_ce0._12_4_ = uVar69;
          local_ce0._16_4_ = uVar69;
          local_ce0._20_4_ = uVar69;
          local_ce0._24_4_ = uVar69;
          local_ce0._28_4_ = uVar69;
          auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_ce0,ZEXT1632(auVar72));
          local_ac0 = vsubps_avx(local_c60,auVar88);
          local_b00 = vsubps_avx(local_a20,auVar84);
          auVar103._0_4_ = auVar88._0_4_ + local_c60._0_4_;
          auVar103._4_4_ = auVar88._4_4_ + local_c60._4_4_;
          auVar103._8_4_ = auVar88._8_4_ + local_c60._8_4_;
          auVar103._12_4_ = auVar88._12_4_ + local_c60._12_4_;
          auVar103._16_4_ = auVar88._16_4_ + local_c60._16_4_;
          auVar103._20_4_ = auVar88._20_4_ + local_c60._20_4_;
          auVar103._24_4_ = auVar88._24_4_ + local_c60._24_4_;
          auVar103._28_4_ = auVar88._28_4_ + local_c60._28_4_;
          auVar99._0_4_ = fVar7 + auVar84._0_4_;
          auVar99._4_4_ = fVar8 + auVar84._4_4_;
          auVar99._8_4_ = fVar9 + auVar84._8_4_;
          auVar99._12_4_ = fVar10 + auVar84._12_4_;
          auVar99._16_4_ = fVar11 + auVar84._16_4_;
          auVar99._20_4_ = fVar12 + auVar84._20_4_;
          auVar99._24_4_ = fVar13 + auVar84._24_4_;
          fVar115 = auVar84._28_4_;
          auVar99._28_4_ = fVar101 + fVar115;
          fVar105 = local_b00._0_4_;
          fVar107 = local_b00._4_4_;
          auVar39._4_4_ = auVar103._4_4_ * fVar107;
          auVar39._0_4_ = auVar103._0_4_ * fVar105;
          fVar14 = local_b00._8_4_;
          auVar39._8_4_ = auVar103._8_4_ * fVar14;
          fVar17 = local_b00._12_4_;
          auVar39._12_4_ = auVar103._12_4_ * fVar17;
          fVar20 = local_b00._16_4_;
          auVar39._16_4_ = auVar103._16_4_ * fVar20;
          fVar23 = local_b00._20_4_;
          auVar39._20_4_ = auVar103._20_4_ * fVar23;
          fVar26 = local_b00._24_4_;
          auVar39._24_4_ = auVar103._24_4_ * fVar26;
          auVar39._28_4_ = fVar101;
          auVar77 = vfmsub231ps_fma(auVar39,local_ac0,auVar99);
          local_ae0 = vsubps_avx(local_c40,auVar74);
          fVar101 = local_ae0._0_4_;
          fVar108 = local_ae0._4_4_;
          auVar40._4_4_ = auVar99._4_4_ * fVar108;
          auVar40._0_4_ = auVar99._0_4_ * fVar101;
          fVar15 = local_ae0._8_4_;
          auVar40._8_4_ = auVar99._8_4_ * fVar15;
          fVar18 = local_ae0._12_4_;
          auVar40._12_4_ = auVar99._12_4_ * fVar18;
          fVar21 = local_ae0._16_4_;
          auVar40._16_4_ = auVar99._16_4_ * fVar21;
          fVar24 = local_ae0._20_4_;
          auVar40._20_4_ = auVar99._20_4_ * fVar24;
          fVar27 = local_ae0._24_4_;
          auVar40._24_4_ = auVar99._24_4_ * fVar27;
          auVar40._28_4_ = auVar99._28_4_;
          auVar117._0_4_ = local_c40._0_4_ + auVar74._0_4_;
          auVar117._4_4_ = local_c40._4_4_ + auVar74._4_4_;
          auVar117._8_4_ = local_c40._8_4_ + auVar74._8_4_;
          auVar117._12_4_ = local_c40._12_4_ + auVar74._12_4_;
          auVar117._16_4_ = local_c40._16_4_ + auVar74._16_4_;
          auVar117._20_4_ = local_c40._20_4_ + auVar74._20_4_;
          auVar117._24_4_ = local_c40._24_4_ + auVar74._24_4_;
          auVar117._28_4_ = local_c40._28_4_ + auVar74._28_4_;
          auVar72 = vfmsub231ps_fma(auVar40,local_b00,auVar117);
          fVar106 = local_ac0._0_4_;
          fVar109 = local_ac0._4_4_;
          auVar41._4_4_ = auVar117._4_4_ * fVar109;
          auVar41._0_4_ = auVar117._0_4_ * fVar106;
          fVar16 = local_ac0._8_4_;
          auVar41._8_4_ = auVar117._8_4_ * fVar16;
          fVar19 = local_ac0._12_4_;
          auVar41._12_4_ = auVar117._12_4_ * fVar19;
          fVar22 = local_ac0._16_4_;
          auVar41._16_4_ = auVar117._16_4_ * fVar22;
          fVar25 = local_ac0._20_4_;
          auVar41._20_4_ = auVar117._20_4_ * fVar25;
          fVar28 = local_ac0._24_4_;
          auVar41._24_4_ = auVar117._24_4_ * fVar28;
          auVar41._28_4_ = auVar117._28_4_;
          auVar78 = vfmsub231ps_fma(auVar41,local_ae0,auVar103);
          auVar42._4_4_ = auVar78._4_4_ * local_aa0;
          auVar42._0_4_ = auVar78._0_4_ * local_aa0;
          auVar42._8_4_ = auVar78._8_4_ * local_aa0;
          auVar42._12_4_ = auVar78._12_4_ * local_aa0;
          auVar42._16_4_ = local_aa0 * 0.0;
          auVar42._20_4_ = local_aa0 * 0.0;
          auVar42._24_4_ = local_aa0 * 0.0;
          auVar42._28_4_ = fVar115;
          auVar72 = vfmadd231ps_fma(auVar42,auVar114,ZEXT1632(auVar72));
          auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),local_ce0,ZEXT1632(auVar77));
          auVar33 = vsubps_avx(auVar74,auVar75);
          auVar90._0_4_ = auVar74._0_4_ + auVar75._0_4_;
          auVar90._4_4_ = auVar74._4_4_ + auVar75._4_4_;
          auVar90._8_4_ = auVar74._8_4_ + auVar75._8_4_;
          auVar90._12_4_ = auVar74._12_4_ + auVar75._12_4_;
          auVar90._16_4_ = auVar74._16_4_ + auVar75._16_4_;
          auVar90._20_4_ = auVar74._20_4_ + auVar75._20_4_;
          auVar90._24_4_ = auVar74._24_4_ + auVar75._24_4_;
          auVar90._28_4_ = auVar74._28_4_ + auVar75._28_4_;
          auVar75 = vsubps_avx(auVar88,auVar80);
          auVar104._0_4_ = auVar88._0_4_ + auVar80._0_4_;
          auVar104._4_4_ = auVar88._4_4_ + auVar80._4_4_;
          auVar104._8_4_ = auVar88._8_4_ + auVar80._8_4_;
          auVar104._12_4_ = auVar88._12_4_ + auVar80._12_4_;
          auVar104._16_4_ = auVar88._16_4_ + auVar80._16_4_;
          auVar104._20_4_ = auVar88._20_4_ + auVar80._20_4_;
          auVar104._24_4_ = auVar88._24_4_ + auVar80._24_4_;
          auVar104._28_4_ = auVar88._28_4_ + auVar80._28_4_;
          auVar80 = vsubps_avx(auVar84,auVar32);
          auVar81._0_4_ = auVar84._0_4_ + auVar32._0_4_;
          auVar81._4_4_ = auVar84._4_4_ + auVar32._4_4_;
          auVar81._8_4_ = auVar84._8_4_ + auVar32._8_4_;
          auVar81._12_4_ = auVar84._12_4_ + auVar32._12_4_;
          auVar81._16_4_ = auVar84._16_4_ + auVar32._16_4_;
          auVar81._20_4_ = auVar84._20_4_ + auVar32._20_4_;
          auVar81._24_4_ = auVar84._24_4_ + auVar32._24_4_;
          auVar81._28_4_ = fVar115 + fVar119;
          auVar84._4_4_ = auVar80._4_4_ * auVar104._4_4_;
          auVar84._0_4_ = auVar80._0_4_ * auVar104._0_4_;
          auVar84._8_4_ = auVar80._8_4_ * auVar104._8_4_;
          auVar84._12_4_ = auVar80._12_4_ * auVar104._12_4_;
          auVar84._16_4_ = auVar80._16_4_ * auVar104._16_4_;
          auVar84._20_4_ = auVar80._20_4_ * auVar104._20_4_;
          auVar84._24_4_ = auVar80._24_4_ * auVar104._24_4_;
          auVar84._28_4_ = fVar119;
          auVar78 = vfmsub231ps_fma(auVar84,auVar75,auVar81);
          auVar32._4_4_ = auVar81._4_4_ * auVar33._4_4_;
          auVar32._0_4_ = auVar81._0_4_ * auVar33._0_4_;
          auVar32._8_4_ = auVar81._8_4_ * auVar33._8_4_;
          auVar32._12_4_ = auVar81._12_4_ * auVar33._12_4_;
          auVar32._16_4_ = auVar81._16_4_ * auVar33._16_4_;
          auVar32._20_4_ = auVar81._20_4_ * auVar33._20_4_;
          auVar32._24_4_ = auVar81._24_4_ * auVar33._24_4_;
          auVar32._28_4_ = auVar81._28_4_;
          auVar77 = vfmsub231ps_fma(auVar32,auVar80,auVar90);
          auVar43._4_4_ = auVar75._4_4_ * auVar90._4_4_;
          auVar43._0_4_ = auVar75._0_4_ * auVar90._0_4_;
          auVar43._8_4_ = auVar75._8_4_ * auVar90._8_4_;
          auVar43._12_4_ = auVar75._12_4_ * auVar90._12_4_;
          auVar43._16_4_ = auVar75._16_4_ * auVar90._16_4_;
          auVar43._20_4_ = auVar75._20_4_ * auVar90._20_4_;
          auVar43._24_4_ = auVar75._24_4_ * auVar90._24_4_;
          auVar43._28_4_ = auVar90._28_4_;
          auVar79 = vfmsub231ps_fma(auVar43,auVar33,auVar104);
          auVar91._0_4_ = local_aa0 * auVar79._0_4_;
          auVar91._4_4_ = local_aa0 * auVar79._4_4_;
          auVar91._8_4_ = local_aa0 * auVar79._8_4_;
          auVar91._12_4_ = local_aa0 * auVar79._12_4_;
          auVar91._16_4_ = local_aa0 * 0.0;
          auVar91._20_4_ = local_aa0 * 0.0;
          auVar91._24_4_ = local_aa0 * 0.0;
          auVar91._28_4_ = 0;
          auVar77 = vfmadd231ps_fma(auVar91,auVar114,ZEXT1632(auVar77));
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),local_ce0,ZEXT1632(auVar78));
          local_9c0 = auVar73._0_4_;
          fStack_9bc = auVar73._4_4_;
          fStack_9b8 = auVar73._8_4_;
          fStack_9b4 = auVar73._12_4_;
          local_980 = ZEXT1632(CONCAT412(auVar77._12_4_ + fStack_9b4 + auVar72._12_4_,
                                         CONCAT48(auVar77._8_4_ + fStack_9b8 + auVar72._8_4_,
                                                  CONCAT44(auVar77._4_4_ +
                                                           fStack_9bc + auVar72._4_4_,
                                                           auVar77._0_4_ + local_9c0 + auVar72._0_4_
                                                          ))));
          auVar82._8_4_ = 0x7fffffff;
          auVar82._0_8_ = 0x7fffffff7fffffff;
          auVar82._12_4_ = 0x7fffffff;
          auVar82._16_4_ = 0x7fffffff;
          auVar82._20_4_ = 0x7fffffff;
          auVar82._24_4_ = 0x7fffffff;
          auVar82._28_4_ = 0x7fffffff;
          local_b20 = ZEXT1632(auVar73);
          auVar74 = vminps_avx(local_b20,ZEXT1632(auVar72));
          auVar74 = vminps_avx(auVar74,ZEXT1632(auVar77));
          local_b40 = vandps_avx(local_980,auVar82);
          fVar115 = local_b40._0_4_ * 1.1920929e-07;
          fVar119 = local_b40._4_4_ * 1.1920929e-07;
          auVar44._4_4_ = fVar119;
          auVar44._0_4_ = fVar115;
          fVar120 = local_b40._8_4_ * 1.1920929e-07;
          auVar44._8_4_ = fVar120;
          fVar121 = local_b40._12_4_ * 1.1920929e-07;
          auVar44._12_4_ = fVar121;
          fVar122 = local_b40._16_4_ * 1.1920929e-07;
          auVar44._16_4_ = fVar122;
          fVar123 = local_b40._20_4_ * 1.1920929e-07;
          auVar44._20_4_ = fVar123;
          fVar124 = local_b40._24_4_ * 1.1920929e-07;
          auVar44._24_4_ = fVar124;
          auVar44._28_4_ = 0x34000000;
          auVar111._0_8_ = CONCAT44(fVar119,fVar115) ^ 0x8000000080000000;
          auVar111._8_4_ = -fVar120;
          auVar111._12_4_ = -fVar121;
          auVar111._16_4_ = -fVar122;
          auVar111._20_4_ = -fVar123;
          auVar111._24_4_ = -fVar124;
          auVar111._28_4_ = 0xb4000000;
          auVar74 = vcmpps_avx(auVar74,auVar111,5);
          auVar84 = vmaxps_avx(local_b20,ZEXT1632(auVar72));
          auVar88 = vmaxps_avx(auVar84,ZEXT1632(auVar77));
          auVar88 = vcmpps_avx(auVar88,auVar44,2);
          auVar88 = vorps_avx(auVar74,auVar88);
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar45._4_4_ = fVar109 * local_a60._4_4_;
            auVar45._0_4_ = fVar106 * local_a60._0_4_;
            auVar45._8_4_ = fVar16 * local_a60._8_4_;
            auVar45._12_4_ = fVar19 * local_a60._12_4_;
            auVar45._16_4_ = fVar22 * local_a60._16_4_;
            auVar45._20_4_ = fVar25 * local_a60._20_4_;
            auVar45._24_4_ = fVar28 * local_a60._24_4_;
            auVar45._28_4_ = auVar74._28_4_;
            auVar46._4_4_ = fVar108 * local_a80._4_4_;
            auVar46._0_4_ = fVar101 * local_a80._0_4_;
            auVar46._8_4_ = fVar15 * local_a80._8_4_;
            auVar46._12_4_ = fVar18 * local_a80._12_4_;
            auVar46._16_4_ = fVar21 * local_a80._16_4_;
            auVar46._20_4_ = fVar24 * local_a80._20_4_;
            auVar46._24_4_ = fVar27 * local_a80._24_4_;
            auVar46._28_4_ = 0x34000000;
            auVar73 = vfmsub213ps_fma(local_a80,local_b00,auVar45);
            auVar47._4_4_ = auVar75._4_4_ * fVar107;
            auVar47._0_4_ = auVar75._0_4_ * fVar105;
            auVar47._8_4_ = auVar75._8_4_ * fVar14;
            auVar47._12_4_ = auVar75._12_4_ * fVar17;
            auVar47._16_4_ = auVar75._16_4_ * fVar20;
            auVar47._20_4_ = auVar75._20_4_ * fVar23;
            auVar47._24_4_ = auVar75._24_4_ * fVar26;
            auVar47._28_4_ = auVar84._28_4_;
            auVar48._4_4_ = fVar108 * auVar80._4_4_;
            auVar48._0_4_ = fVar101 * auVar80._0_4_;
            auVar48._8_4_ = fVar15 * auVar80._8_4_;
            auVar48._12_4_ = fVar18 * auVar80._12_4_;
            auVar48._16_4_ = fVar21 * auVar80._16_4_;
            auVar48._20_4_ = fVar24 * auVar80._20_4_;
            auVar48._24_4_ = fVar27 * auVar80._24_4_;
            auVar48._28_4_ = local_b40._28_4_;
            auVar77 = vfmsub213ps_fma(auVar80,local_ac0,auVar47);
            auVar74 = vandps_avx(auVar45,auVar82);
            auVar84 = vandps_avx(auVar47,auVar82);
            auVar74 = vcmpps_avx(auVar74,auVar84,1);
            local_960 = vblendvps_avx(ZEXT1632(auVar77),ZEXT1632(auVar73),auVar74);
            auVar49._4_4_ = fVar109 * auVar33._4_4_;
            auVar49._0_4_ = fVar106 * auVar33._0_4_;
            auVar49._8_4_ = fVar16 * auVar33._8_4_;
            auVar49._12_4_ = fVar19 * auVar33._12_4_;
            auVar49._16_4_ = fVar22 * auVar33._16_4_;
            auVar49._20_4_ = fVar25 * auVar33._20_4_;
            auVar49._24_4_ = fVar28 * auVar33._24_4_;
            auVar49._28_4_ = auVar74._28_4_;
            auVar73 = vfmsub213ps_fma(auVar33,local_b00,auVar48);
            auVar50._4_4_ = local_a40._4_4_ * fVar107;
            auVar50._0_4_ = local_a40._0_4_ * fVar105;
            auVar50._8_4_ = local_a40._8_4_ * fVar14;
            auVar50._12_4_ = local_a40._12_4_ * fVar17;
            auVar50._16_4_ = local_a40._16_4_ * fVar20;
            auVar50._20_4_ = local_a40._20_4_ * fVar23;
            auVar50._24_4_ = local_a40._24_4_ * fVar26;
            auVar50._28_4_ = auVar84._28_4_;
            auVar77 = vfmsub213ps_fma(local_a60,local_ae0,auVar50);
            auVar74 = vandps_avx(auVar50,auVar82);
            auVar84 = vandps_avx(auVar48,auVar82);
            auVar74 = vcmpps_avx(auVar74,auVar84,1);
            local_940 = vblendvps_avx(ZEXT1632(auVar73),ZEXT1632(auVar77),auVar74);
            auVar73 = vfmsub213ps_fma(local_a40,local_ac0,auVar46);
            auVar77 = vfmsub213ps_fma(auVar75,local_ae0,auVar49);
            auVar74 = vandps_avx(auVar46,auVar82);
            auVar84 = vandps_avx(auVar49,auVar82);
            auVar74 = vcmpps_avx(auVar74,auVar84,1);
            local_920 = vblendvps_avx(ZEXT1632(auVar77),ZEXT1632(auVar73),auVar74);
            auVar73 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            fVar101 = local_920._0_4_;
            auVar83._0_4_ = fVar101 * local_aa0;
            fVar115 = local_920._4_4_;
            auVar83._4_4_ = fVar115 * local_aa0;
            fVar105 = local_920._8_4_;
            auVar83._8_4_ = fVar105 * local_aa0;
            fVar106 = local_920._12_4_;
            auVar83._12_4_ = fVar106 * local_aa0;
            fVar107 = local_920._16_4_;
            auVar83._16_4_ = fVar107 * local_aa0;
            fVar108 = local_920._20_4_;
            auVar83._20_4_ = fVar108 * local_aa0;
            fVar109 = local_920._24_4_;
            auVar83._24_4_ = fVar109 * local_aa0;
            auVar83._28_4_ = 0;
            auVar77 = vfmadd213ps_fma(auVar114,local_940,auVar83);
            auVar77 = vfmadd213ps_fma(local_ce0,local_960,ZEXT1632(auVar77));
            auVar84 = ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                         CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                  CONCAT44(auVar77._4_4_ + auVar77._4_4_,
                                                           auVar77._0_4_ + auVar77._0_4_))));
            auVar51._4_4_ = fVar115 * fVar8;
            auVar51._0_4_ = fVar101 * fVar7;
            auVar51._8_4_ = fVar105 * fVar9;
            auVar51._12_4_ = fVar106 * fVar10;
            auVar51._16_4_ = fVar107 * fVar11;
            auVar51._20_4_ = fVar108 * fVar12;
            auVar51._24_4_ = fVar109 * fVar13;
            auVar51._28_4_ = auVar88._28_4_;
            auVar77 = vfmadd213ps_fma(local_c60,local_940,auVar51);
            auVar78 = vfmadd213ps_fma(local_c40,local_960,ZEXT1632(auVar77));
            auVar74 = vrcpps_avx(auVar84);
            auVar127._8_4_ = 0x3f800000;
            auVar127._0_8_ = &DAT_3f8000003f800000;
            auVar127._12_4_ = 0x3f800000;
            auVar127._16_4_ = 0x3f800000;
            auVar127._20_4_ = 0x3f800000;
            auVar127._24_4_ = 0x3f800000;
            auVar127._28_4_ = 0x3f800000;
            auVar77 = vfnmadd213ps_fma(auVar74,auVar84,auVar127);
            auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar74,auVar74);
            local_8a0 = ZEXT1632(CONCAT412(auVar77._12_4_ * (auVar78._12_4_ + auVar78._12_4_),
                                           CONCAT48(auVar77._8_4_ * (auVar78._8_4_ + auVar78._8_4_),
                                                    CONCAT44(auVar77._4_4_ *
                                                             (auVar78._4_4_ + auVar78._4_4_),
                                                             auVar77._0_4_ *
                                                             (auVar78._0_4_ + auVar78._0_4_)))));
            uVar69 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar118._4_4_ = uVar69;
            auVar118._0_4_ = uVar69;
            auVar118._8_4_ = uVar69;
            auVar118._12_4_ = uVar69;
            auVar118._16_4_ = uVar69;
            auVar118._20_4_ = uVar69;
            auVar118._24_4_ = uVar69;
            auVar118._28_4_ = uVar69;
            uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar126._4_4_ = uVar69;
            auVar126._0_4_ = uVar69;
            auVar126._8_4_ = uVar69;
            auVar126._12_4_ = uVar69;
            auVar126._16_4_ = uVar69;
            auVar126._20_4_ = uVar69;
            auVar126._24_4_ = uVar69;
            auVar126._28_4_ = uVar69;
            auVar74 = vcmpps_avx(auVar118,local_8a0,2);
            auVar88 = vcmpps_avx(local_8a0,auVar126,2);
            auVar74 = vandps_avx(auVar74,auVar88);
            auVar77 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
            auVar73 = vpand_avx(auVar77,auVar73);
            auVar74 = vpmovsxwd_avx2(auVar73);
            if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0x7f,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar74 >> 0xbf,0) != '\0') ||
                (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar74[0x1f] < '\0') {
              auVar74 = vcmpps_avx(auVar84,_DAT_02020f00,4);
              auVar77 = vpackssdw_avx(auVar74._0_16_,auVar74._16_16_);
              auVar73 = vpand_avx(auVar73,auVar77);
              local_900 = vpmovsxwd_avx2(auVar73);
              if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (local_900 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_900 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_900 >> 0x7f,0) != '\0') ||
                    (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(local_900 >> 0xbf,0) != '\0') ||
                  (local_900 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  local_900[0x1f] < '\0') {
                uStack_9b0 = 0;
                uStack_9ac = 0;
                uStack_9a8 = 0;
                uStack_9a4 = 0;
                local_9a0 = ZEXT1632(auVar72);
                local_820 = local_b60;
                auStack_cb8 = auVar114._8_24_;
                local_cc0 = context->scene;
                auVar74 = vrcpps_avx(local_980);
                auVar100._8_4_ = 0x3f800000;
                auVar100._0_8_ = &DAT_3f8000003f800000;
                auVar100._12_4_ = 0x3f800000;
                auVar100._16_4_ = 0x3f800000;
                auVar100._20_4_ = 0x3f800000;
                auVar100._24_4_ = 0x3f800000;
                auVar100._28_4_ = 0x3f800000;
                auVar77 = vfnmadd213ps_fma(local_980,auVar74,auVar100);
                auVar77 = vfmadd132ps_fma(ZEXT1632(auVar77),auVar74,auVar74);
                auVar92._8_4_ = 0x219392ef;
                auVar92._0_8_ = 0x219392ef219392ef;
                auVar92._12_4_ = 0x219392ef;
                auVar92._16_4_ = 0x219392ef;
                auVar92._20_4_ = 0x219392ef;
                auVar92._24_4_ = 0x219392ef;
                auVar92._28_4_ = 0x219392ef;
                auVar74 = vcmpps_avx(local_b40,auVar92,5);
                auVar74 = vandps_avx(auVar74,ZEXT1632(auVar77));
                auVar52._4_4_ = fStack_9bc * auVar74._4_4_;
                auVar52._0_4_ = local_9c0 * auVar74._0_4_;
                auVar52._8_4_ = fStack_9b8 * auVar74._8_4_;
                auVar52._12_4_ = fStack_9b4 * auVar74._12_4_;
                auVar52._16_4_ = auVar74._16_4_ * 0.0;
                auVar52._20_4_ = auVar74._20_4_ * 0.0;
                auVar52._24_4_ = auVar74._24_4_ * 0.0;
                auVar52._28_4_ = 0;
                auVar88 = vminps_avx(auVar52,auVar100);
                auVar53._4_4_ = auVar72._4_4_ * auVar74._4_4_;
                auVar53._0_4_ = auVar72._0_4_ * auVar74._0_4_;
                auVar53._8_4_ = auVar72._8_4_ * auVar74._8_4_;
                auVar53._12_4_ = auVar72._12_4_ * auVar74._12_4_;
                auVar53._16_4_ = auVar74._16_4_ * 0.0;
                auVar53._20_4_ = auVar74._20_4_ * 0.0;
                auVar53._24_4_ = auVar74._24_4_ * 0.0;
                auVar53._28_4_ = auVar74._28_4_;
                auVar74 = vminps_avx(auVar53,auVar100);
                auVar84 = vsubps_avx(auVar100,auVar88);
                auVar75 = vsubps_avx(auVar100,auVar74);
                local_8c0 = vblendvps_avx(auVar74,auVar84,local_b60);
                local_8e0 = vblendvps_avx(auVar88,auVar75,local_b60);
                local_860._4_4_ = (float)local_b80._4_4_ * local_940._4_4_;
                local_860._0_4_ = (float)local_b80._0_4_ * local_940._0_4_;
                local_860._8_4_ = fStack_b78 * local_940._8_4_;
                local_860._12_4_ = fStack_b74 * local_940._12_4_;
                local_860._16_4_ = fStack_b70 * local_940._16_4_;
                local_860._20_4_ = fStack_b6c * local_940._20_4_;
                local_860._24_4_ = fStack_b68 * local_940._24_4_;
                local_860._28_4_ = local_8c0._28_4_;
                local_880[0] = local_960._0_4_ * (float)local_b80._0_4_;
                local_880[1] = local_960._4_4_ * (float)local_b80._4_4_;
                local_880[2] = local_960._8_4_ * fStack_b78;
                local_880[3] = local_960._12_4_ * fStack_b74;
                fStack_870 = local_960._16_4_ * fStack_b70;
                fStack_86c = local_960._20_4_ * fStack_b6c;
                fStack_868 = local_960._24_4_ * fStack_b68;
                uStack_864 = local_8e0._28_4_;
                local_840[0] = (float)local_b80._0_4_ * fVar101;
                local_840[1] = (float)local_b80._4_4_ * fVar115;
                local_840[2] = fStack_b78 * fVar105;
                local_840[3] = fStack_b74 * fVar106;
                fStack_830 = fStack_b70 * fVar107;
                fStack_82c = fStack_b6c * fVar108;
                fStack_828 = fStack_b68 * fVar109;
                uStack_824 = uStack_b64;
                auVar73 = vpacksswb_avx(auVar73,auVar73);
                uVar59 = (ulong)(byte)(SUB161(auVar73 >> 7,0) & 1 |
                                       (SUB161(auVar73 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar73 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar73 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar73 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar73 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar73 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar73 >> 0x3f,0) << 7);
                fStack_a9c = local_aa0;
                fStack_a98 = local_aa0;
                fStack_a94 = local_aa0;
                fStack_a90 = local_aa0;
                fStack_a8c = local_aa0;
                fStack_a88 = local_aa0;
                fStack_a84 = local_aa0;
                do {
                  uVar34 = 0;
                  for (uVar35 = uVar59; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000
                      ) {
                    uVar34 = uVar34 + 1;
                  }
                  uVar68 = *(uint *)((long)&local_9e0 + uVar34 * 4);
                  lVar61 = *(long *)(*(long *)((long)local_cc0 + 0x1e8) + (ulong)uVar68 * 8);
                  if ((*(uint *)(lVar61 + 0x34) & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar59 = uVar59 ^ 1L << (uVar34 & 0x3f);
                    bVar71 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (*(long *)(lVar61 + 0x48) == 0)) {
                    bVar71 = false;
                  }
                  else {
                    local_ce0._0_8_ = uVar62;
                    local_c40._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar62 = (ulong)(uint)((int)uVar34 * 4);
                    uVar69 = *(undefined4 *)(local_8e0 + uVar62);
                    local_be0._4_4_ = uVar69;
                    local_be0._0_4_ = uVar69;
                    local_be0._8_4_ = uVar69;
                    local_be0._12_4_ = uVar69;
                    uVar69 = *(undefined4 *)(local_8c0 + uVar62);
                    local_bd0._4_4_ = uVar69;
                    local_bd0._0_4_ = uVar69;
                    local_bd0._8_4_ = uVar69;
                    local_bd0._12_4_ = uVar69;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar62);
                    local_c90.context = context->user;
                    local_bb0._4_4_ = uVar68;
                    local_bb0._0_4_ = uVar68;
                    local_bb0._8_4_ = uVar68;
                    local_bb0._12_4_ = uVar68;
                    local_bc0 = *(undefined4 *)((long)&local_a00 + uVar62);
                    local_c10 = *(undefined4 *)((long)local_880 + uVar62);
                    uVar69 = *(undefined4 *)(local_860 + uVar62);
                    local_c00._4_4_ = uVar69;
                    local_c00._0_4_ = uVar69;
                    local_c00._8_4_ = uVar69;
                    local_c00._12_4_ = uVar69;
                    uVar69 = *(undefined4 *)((long)local_840 + uVar62);
                    local_bf0._4_4_ = uVar69;
                    local_bf0._0_4_ = uVar69;
                    local_bf0._8_4_ = uVar69;
                    local_bf0._12_4_ = uVar69;
                    vpcmpeqd_avx2(ZEXT1632(local_bb0),ZEXT1632(local_bb0));
                    uStack_b9c = (local_c90.context)->instID[0];
                    local_ba0 = uStack_b9c;
                    uStack_b98 = uStack_b9c;
                    uStack_b94 = uStack_b9c;
                    uStack_b90 = (local_c90.context)->instPrimID[0];
                    uStack_b8c = uStack_b90;
                    uStack_b88 = uStack_b90;
                    uStack_b84 = uStack_b90;
                    local_d10 = *local_d00;
                    uStack_d08 = local_d00[1];
                    local_c90.valid = (int *)&local_d10;
                    local_c90.geometryUserPtr = *(void **)(lVar61 + 0x18);
                    local_c90.hit = (RTCHitN *)&local_c10;
                    local_c90.N = 4;
                    local_c90.ray = (RTCRayN *)ray;
                    uStack_c0c = local_c10;
                    uStack_c08 = local_c10;
                    uStack_c04 = local_c10;
                    uStack_bbc = local_bc0;
                    uStack_bb8 = local_bc0;
                    uStack_bb4 = local_bc0;
                    if (*(code **)(lVar61 + 0x48) != (code *)0x0) {
                      local_c60._0_8_ = k;
                      (**(code **)(lVar61 + 0x48))(&local_c90);
                      k = local_c60._0_8_;
                    }
                    auVar73._8_8_ = uStack_d08;
                    auVar73._0_8_ = local_d10;
                    if (auVar73 == (undefined1  [16])0x0) {
                      auVar73 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                      auVar73 = auVar73 ^ _DAT_01febe20;
                      uVar62 = local_ce0._0_8_;
                    }
                    else {
                      p_Var6 = context->args->filter;
                      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT || ((*(byte *)(lVar61 + 0x3e) & 0x40) != 0)
                          ))) {
                        (*p_Var6)(&local_c90);
                      }
                      auVar58._8_8_ = uStack_d08;
                      auVar58._0_8_ = local_d10;
                      auVar72 = vpcmpeqd_avx((undefined1  [16])0x0,auVar58);
                      auVar73 = auVar72 ^ _DAT_01febe20;
                      auVar87._8_4_ = 0xff800000;
                      auVar87._0_8_ = 0xff800000ff800000;
                      auVar87._12_4_ = 0xff800000;
                      auVar72 = vblendvps_avx(auVar87,*(undefined1 (*) [16])(local_c90.ray + 0x80),
                                              auVar72);
                      *(undefined1 (*) [16])(local_c90.ray + 0x80) = auVar72;
                      uVar62 = local_ce0._0_8_;
                    }
                    auVar73 = vpslld_avx(auVar73,0x1f);
                    bVar56 = (auVar73 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar57 = (auVar73 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar55 = (auVar73 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
                    bVar54 = -1 < auVar73[0xf];
                    bVar71 = ((bVar56 && bVar57) && bVar55) && bVar54;
                    if (((bVar56 && bVar57) && bVar55) && bVar54) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_c40._0_4_;
                      uVar59 = uVar59 ^ 1L << (uVar34 & 0x3f);
                    }
                  }
                  uVar68 = 0;
                  if (!bVar71) {
                    if (bVar70) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar68 = 1;
                    }
                    goto LAB_00582069;
                  }
                } while (uVar59 != 0);
              }
            }
          }
          uVar68 = 0;
          uVar63 = uVar63 + 1;
          bVar70 = uVar63 < local_cf8;
        } while (uVar63 != local_cf8);
      }
    }
LAB_00582069:
  } while ((uVar68 & 3) == 0);
  return local_cf0 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }